

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O2

word Extra_Truth6MinimumHeuristic(word t)

{
  ulong uVar1;
  long lVar2;
  word wVar3;
  word wVar4;
  uint uVar5;
  
  uVar1 = (t >> 1 & 0x5555555555555555) + (t & 0x5555555555555555);
  uVar1 = (uVar1 >> 2 & 0x3333333333333333) + (uVar1 & 0x3333333333333333);
  uVar1 = (uVar1 >> 4 & 0x707070707070707) + (uVar1 & 0x707070707070707);
  uVar1 = (uVar1 >> 8 & 0xf000f000f000f) + (uVar1 & 0xf000f000f000f);
  lVar2 = (uVar1 >> 0x10 & 0x1f0000001f) + (uVar1 & 0x1f0000001f);
  uVar5 = (int)((ulong)lVar2 >> 0x20) + (int)lVar2;
  if (0x1f < uVar5) {
    if (uVar5 == 0x20) {
      wVar3 = Extra_Truth6MinimumRoundMany(t);
      wVar4 = Extra_Truth6MinimumRoundMany(~t);
      if (wVar3 < wVar4) {
        wVar4 = wVar3;
      }
      return wVar4;
    }
    t = ~t;
  }
  wVar4 = Extra_Truth6MinimumRoundMany(t);
  return wVar4;
}

Assistant:

word Extra_Truth6MinimumHeuristic( word t )
{
    word tMin1, tMin2;
    int nOnes = Extra_Truth6Ones( t );
    if ( nOnes < 32 )
        return Extra_Truth6MinimumRoundMany( t );
    if ( nOnes > 32 )
        return Extra_Truth6MinimumRoundMany( ~t );
    tMin1 = Extra_Truth6MinimumRoundMany(  t );
    tMin2 = Extra_Truth6MinimumRoundMany( ~t );
    return Abc_MinWord( tMin1, tMin2 );
}